

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O3

void doActivate<false>(QObject *sender,int signal_index,void **argv)

{
  QBasicMutex *pQVar1;
  __pointer_type pQVar2;
  ushort uVar3;
  __atomic_base<unsigned_int> _Var4;
  long lVar5;
  QObjectPrivate *this;
  AtomicType AVar6;
  QObjectData *pQVar7;
  QObjectData *pQVar8;
  AtomicType receiver;
  __pointer_type pQVar9;
  QObject *pQVar10;
  QObjectData *pQVar11;
  ConnectionData *this_00;
  bool bVar12;
  uint uVar13;
  int iVar14;
  undefined4 extraout_var;
  char *pcVar15;
  undefined4 extraout_var_00;
  char *pcVar16;
  QMetaCallEvent *this_01;
  undefined4 extraout_var_01;
  uint uVar17;
  ulong uVar18;
  AtomicType AVar19;
  __pointer_type pSVar20;
  __base_type _Var21;
  Connection *c;
  long in_FS_OFFSET;
  QSlotObjectBase *local_78;
  ConnectionDataPointer connections;
  QSemaphore semaphore;
  int iStack_60;
  undefined4 uStack_5c;
  void *empty_argv [1];
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  this = (QObjectPrivate *)(sender->d_ptr).d;
  uVar13 = *(uint *)&(this->super_QObjectData).field_0x30;
  if ((uVar13 & 2) == 0) {
    if ((((uVar13 & 8) == 0) &&
        (QAbstractDeclarativeData::isSignalConnected !=
         (_func_bool_QAbstractDeclarativeData_ptr_QObject_ptr_int *)0x0 &&
         (this->field_3).declarativeData != (QAbstractDeclarativeData *)0x0)) &&
       (bVar12 = (*QAbstractDeclarativeData::isSignalConnected)
                           ((this->field_3).declarativeData,(this->super_QObjectData).q_ptr,
                            signal_index),
       QAbstractDeclarativeData::signalEmitted !=
       (_func_void_QAbstractDeclarativeData_ptr_QObject_ptr_int_void_ptr_ptr *)0x0 && bVar12)) {
      (*QAbstractDeclarativeData::signalEmitted)
                ((this->field_3).declarativeData,sender,signal_index,argv);
    }
    empty_argv[0] = (void *)0x0;
    if (argv == (void **)0x0) {
      argv = empty_argv;
    }
    bVar12 = QObjectPrivate::maybeSignalConnected(this,signal_index);
    if (bVar12) {
      connections.d.ptr =
           (totally_ordered_wrapper<QObjectPrivate::ConnectionData_*>)
           (this->connections).super_QBasicAtomicPointer<QObjectPrivate::ConnectionData>._q_value.
           _M_b._M_p;
      if (connections.d.ptr != (ConnectionData *)0x0) {
        LOCK();
        (((ConnectionData *)connections.d.ptr)->ref).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value =
             (Type)((int)(((ConnectionData *)connections.d.ptr)->ref).super_QAtomicInteger<int>.
                         super_QBasicAtomicInteger<int>._q_value + 1);
        UNLOCK();
      }
      AVar6._M_b._M_p =
           (((ConnectionData *)connections.d.ptr)->signalVector).
           super_QBasicAtomicPointer<QObjectPrivate::SignalVector>._q_value._M_b;
      AVar19._M_b._M_p =
           (__base_type)(__pointer_type)((long)AVar6._M_b._M_p + ((long)signal_index + 1) * 0x10);
      if (*(int *)((long)AVar6._M_b._M_p + 8) <= signal_index) {
        AVar19._M_b._M_p = AVar6._M_b._M_p;
      }
      pQVar7 = *(QObjectData **)(in_FS_OFFSET + 0x10);
      pQVar8 = (sender->d_ptr).d[1].q_ptr[5].d_ptr.d;
      _Var4._M_i = *(__int_type_conflict3 *)
                    &(((ConnectionData *)connections.d.ptr)->currentConnectionId).
                     super_QBasicAtomicInteger<unsigned_int>._q_value;
      pSVar20 = (__pointer_type)((long)AVar19._M_b._M_p + 0x10);
      do {
        c = (pSVar20->super_ConnectionOrSignalVector).field_0.next;
        if (c != (Connection *)0x0) {
          do {
            receiver._M_b._M_p = *(__base_type *)&(c->receiver).super_QBasicAtomicPointer<QObject>;
            if (((AtomicType)receiver._M_b._M_p != (AtomicType)0x0) &&
               (pQVar9 = (c->receiverThreadData).super_QBasicAtomicPointer<QThreadData>._q_value.
                         _M_b._M_p, pQVar9 != (__pointer_type)0x0)) {
              iStack_60 = (int)receiver._M_b._M_p;
              if (pQVar7 == pQVar8) {
                _Var21._M_p = (pQVar9->threadId).super_QBasicAtomicPointer<void>._q_value._M_b._M_p;
              }
              else {
                uVar18 = (ulong)(iStack_60 +
                                 (int)(((ulong)receiver._M_b._M_p & 0xffffffff) / 0x418) * -0x418 &
                                0x7f8);
                pQVar1 = (QBasicMutex *)
                         ((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p + uVar18);
                if (*(long *)((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p + uVar18) == 0)
                {
                  LOCK();
                  bVar12 = (pQVar1->d_ptr)._q_value._M_b._M_p == (__pointer_type)0x0;
                  if (bVar12) {
                    (pQVar1->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x1;
                  }
                  UNLOCK();
                  if (!bVar12) goto LAB_002b9c42;
                }
                else {
LAB_002b9c42:
                  QBasicMutex::lockInternal(pQVar1);
                }
                _Var21._M_p = (pQVar9->threadId).super_QBasicAtomicPointer<void>._q_value._M_b._M_p;
                LOCK();
                pQVar2 = (pQVar1->d_ptr)._q_value._M_b._M_p;
                (pQVar1->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x0;
                UNLOCK();
                if (pQVar2 != (__pointer_type)0x1) {
                  QBasicMutex::unlockInternalFutex(pQVar1,pQVar2);
                }
              }
              uVar13 = *(uint *)&c->field_0x54;
              if ((pQVar7 == (QObjectData *)_Var21._M_p) || ((uVar13 & 0x18000000) != 0)) {
                uVar17 = uVar13 >> 0x1b & 3;
                if (uVar17 == 3) {
                  if (pQVar7 == (QObjectData *)_Var21._M_p) {
                    semaphore.field_0.u32[0]._q_value.super___atomic_base<unsigned_int>._M_i =
                         (QBasicAtomicInteger<unsigned_int>)(Type)0x2;
                    semaphore.field_0.u32[1]._q_value.super___atomic_base<unsigned_int>._M_i =
                         (QBasicAtomicInteger<unsigned_int>)(Type)0x0;
                    iVar14 = (**sender->_vptr_QObject)();
                    pcVar15 = QMetaObject::className((QMetaObject *)CONCAT44(extraout_var,iVar14));
                    iVar14 = (***(_func_int ***)receiver._M_b._M_p)(receiver._M_b._M_p);
                    pcVar16 = QMetaObject::className
                                        ((QMetaObject *)CONCAT44(extraout_var_00,iVar14));
                    QMessageLogger::warning
                              ((QMessageLogger *)&semaphore,
                               "Qt: Dead lock detected while activating a BlockingQueuedConnection: Sender is %s(%p), receiver is %s(%p)"
                               ,pcVar15,sender,pcVar16,receiver._M_b._M_p);
                    uVar13 = *(uint *)&c->field_0x54;
                  }
                  if (((int)uVar13 < 0) && (bVar12 = QObjectPrivate::removeConnection(c), !bVar12))
                  goto LAB_002b9ca8;
                  semaphore.field_0.u32[0]._q_value.super___atomic_base<unsigned_int>._M_i =
                       (QBasicAtomicInteger<unsigned_int>)(Type)0xaaaaaaaa;
                  semaphore.field_0.u32[1]._q_value.super___atomic_base<unsigned_int>._M_i =
                       (QBasicAtomicInteger<unsigned_int>)(Type)0xaaaaaaaa;
                  QSemaphore::QSemaphore(&semaphore,0);
                  uVar18 = (ulong)(iStack_60 +
                                   (int)(((ulong)receiver._M_b._M_p & 0xffffffff) / 0x418) * -0x418
                                  & 0x7f8);
                  pQVar1 = (QBasicMutex *)
                           ((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p + uVar18);
                  if (*(long *)((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p + uVar18) == 0
                     ) {
                    LOCK();
                    bVar12 = (pQVar1->d_ptr)._q_value._M_b._M_p == (__pointer_type)0x0;
                    if (bVar12) {
                      (pQVar1->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x1;
                    }
                    UNLOCK();
                    if (!bVar12) goto LAB_002b9daf;
                  }
                  else {
LAB_002b9daf:
                    QBasicMutex::lockInternal(pQVar1);
                  }
                  uVar13 = *(uint *)&c->field_0x54;
                  if ((int)uVar13 < 0) {
LAB_002b9dd3:
                    if ((uVar13 >> 0x1d & 1) == 0) {
                      this_01 = (QMetaCallEvent *)operator_new(0x78);
                      QMetaCallEvent::QMetaCallEvent
                                (this_01,c->method_offset,c->method_relative,
                                 (c->field_6).callFunction,sender,signal_index,argv,&semaphore);
                    }
                    else {
                      this_01 = (QMetaCallEvent *)operator_new(0x78);
                      QMetaCallEvent::QMetaCallEvent
                                (this_01,(c->field_6).slotObj,sender,signal_index,argv,&semaphore);
                    }
                    QCoreApplication::postEvent((QObject *)receiver._M_b._M_p,(QEvent *)this_01,0);
                    LOCK();
                    pQVar2 = (pQVar1->d_ptr)._q_value._M_b._M_p;
                    (pQVar1->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x0;
                    UNLOCK();
                    if (pQVar2 != (__pointer_type)0x1) {
                      QBasicMutex::unlockInternalFutex(pQVar1,pQVar2);
                    }
                    QSemaphore::acquire(&semaphore,1);
                  }
                  else {
                    if ((c->receiver).super_QBasicAtomicPointer<QObject>._q_value._M_b._M_p !=
                        (__pointer_type)0x0) {
                      uVar13 = *(uint *)&c->field_0x54;
                      goto LAB_002b9dd3;
                    }
                    LOCK();
                    pQVar2 = (pQVar1->d_ptr)._q_value._M_b._M_p;
                    (pQVar1->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x0;
                    UNLOCK();
                    if (pQVar2 != (__pointer_type)0x1) {
                      QBasicMutex::unlockInternalFutex(pQVar1,pQVar2);
                    }
                  }
                  QSemaphore::~QSemaphore(&semaphore);
                  goto LAB_002b9ca8;
                }
                if (uVar17 != 2) {
                  if (((int)uVar13 < 0) && (bVar12 = QObjectPrivate::removeConnection(c), !bVar12))
                  goto LAB_002b9ca8;
                  if (pQVar7 == (QObjectData *)_Var21._M_p) {
                    pQVar10 = ((QScopedPointer<QObjectData,_QScopedPointerDeleter<QObjectData>_> *)
                              ((long)receiver._M_b._M_p + 8))->d[1].parent;
                    semaphore.field_0.u32[0]._q_value.super___atomic_base<unsigned_int>._M_i =
                         (QBasicAtomicInteger<unsigned_int>)(Type)0x0;
                    semaphore.field_0.u32[1]._q_value.super___atomic_base<unsigned_int>._M_i =
                         (QBasicAtomicInteger<unsigned_int>)(Type)0x0;
                    uStack_5c = receiver._M_b._M_p._4_4_;
                    if (pQVar10 != (QObject *)0x0) {
                      pQVar11 = pQVar10[1].d_ptr.d;
                      semaphore.field_0.u32[0]._q_value.super___atomic_base<unsigned_int>._M_i =
                           SUB84(pQVar11,0);
                      semaphore.field_0.u32[1]._q_value.super___atomic_base<unsigned_int>._M_i =
                           SUB84((ulong)pQVar11 >> 0x20,0);
                      pQVar10[1].d_ptr.d = (QObjectData *)&semaphore;
                    }
                  }
                  else {
                    semaphore.field_0.u32[0]._q_value.super___atomic_base<unsigned_int>._M_i =
                         (QBasicAtomicInteger<unsigned_int>)(Type)0x0;
                    semaphore.field_0.u32[1]._q_value.super___atomic_base<unsigned_int>._M_i =
                         (QBasicAtomicInteger<unsigned_int>)(Type)0x0;
                    iStack_60 = 0;
                    uStack_5c = 0;
                  }
                  if ((c->field_0x57 & 0x20) == 0) {
                    if ((c->field_6).callFunction != (StaticMetaCallFunction)0x0) {
                      uVar3 = c->method_offset;
                      iVar14 = (***(_func_int ***)receiver._M_b._M_p)(receiver._M_b._M_p);
                      iVar14 = QMetaObject::methodOffset
                                         ((QMetaObject *)CONCAT44(extraout_var_01,iVar14));
                      if ((int)(uint)uVar3 <= iVar14) {
                        (*(c->field_6).callFunction)
                                  ((QObject *)receiver._M_b._M_p,InvokeMetaMethod,
                                   (uint)c->method_relative,argv);
                        goto LAB_002b9fd1;
                      }
                    }
                    QMetaObject::metacall
                              ((QObject *)receiver._M_b._M_p,InvokeMetaMethod,
                               (uint)c->method_offset + (uint)c->method_relative,argv);
                  }
                  else {
                    local_78 = (c->field_6).slotObj;
                    LOCK();
                    (local_78->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                    _q_value.super___atomic_base<int>._M_i =
                         (local_78->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                         _q_value.super___atomic_base<int>._M_i + 1;
                    UNLOCK();
                    (*local_78->m_impl)(1,local_78,(QObject *)receiver._M_b._M_p,argv,(bool *)0x0);
                    if (local_78 != (QSlotObjectBase *)0x0) {
                      QtPrivate::QSlotObjectBase::Deleter::operator()((Deleter *)&local_78,local_78)
                      ;
                    }
                  }
LAB_002b9fd1:
                  if (CONCAT44(uStack_5c,iStack_60) != 0) {
                    *(ulong *)(*(long *)(*(long *)(CONCAT44(uStack_5c,iStack_60) + 8) + 0x60) + 0x18
                              ) = CONCAT44(semaphore.field_0.u32[1]._q_value.
                                           super___atomic_base<unsigned_int>._M_i,
                                           semaphore.field_0.u32[0]._q_value.
                                           super___atomic_base<unsigned_int>._M_i);
                  }
                  goto LAB_002b9ca8;
                }
              }
              queued_activate(sender,signal_index,c,argv);
            }
LAB_002b9ca8:
            c = (c->nextConnectionList).super_QBasicAtomicPointer<QObjectPrivate::Connection>.
                _q_value._M_b._M_p;
          } while ((c != (__pointer_type)0x0) && (c->id <= _Var4._M_i));
        }
        bVar12 = pSVar20 != (__pointer_type)((long)AVar6._M_b._M_p + 0x10U);
        pSVar20 = (__pointer_type)((long)AVar6._M_b._M_p + 0x10U);
      } while (bVar12);
      iVar14 = *(int *)connections.d.ptr;
      QExplicitlySharedDataPointer<QObjectPrivate::ConnectionData>::~QExplicitlySharedDataPointer
                (&connections);
      if (((iVar14 != 0) &&
          (this_00 = (this->connections).super_QBasicAtomicPointer<QObjectPrivate::ConnectionData>.
                     _q_value._M_b._M_p, (this_00->orphaned)._M_i.c != 0)) &&
         ((__atomic_base<int>)
          *(__int_type_conflict *)
           &(this_00->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value ==
          (__atomic_base<int>)0x1)) {
        QObjectPrivate::ConnectionData::cleanOrphanedConnectionsImpl(this_00,sender,NeedToLock);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar5) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void doActivate(QObject *sender, int signal_index, void **argv)
{
    QObjectPrivate *sp = QObjectPrivate::get(sender);

    if (sp->blockSig)
        return;

    Q_TRACE_SCOPE(QMetaObject_activate, sender, signal_index);

    if (sp->isDeclarativeSignalConnected(signal_index)
            && QAbstractDeclarativeData::signalEmitted) {
        Q_TRACE_SCOPE(QMetaObject_activate_declarative_signal, sender, signal_index);
        QAbstractDeclarativeData::signalEmitted(sp->declarativeData, sender,
                                                signal_index, argv);
    }

    const QSignalSpyCallbackSet *signal_spy_set = callbacks_enabled ? qt_signal_spy_callback_set.loadAcquire() : nullptr;

    void *empty_argv[] = { nullptr };
    if (!argv)
        argv = empty_argv;

    if (!sp->maybeSignalConnected(signal_index)) {
        // The possible declarative connection is done, and nothing else is connected
        if (callbacks_enabled && signal_spy_set->signal_begin_callback != nullptr)
            signal_spy_set->signal_begin_callback(sender, signal_index, argv);
        if (callbacks_enabled && signal_spy_set->signal_end_callback != nullptr)
            signal_spy_set->signal_end_callback(sender, signal_index);
        return;
    }

    if (callbacks_enabled && signal_spy_set->signal_begin_callback != nullptr)
        signal_spy_set->signal_begin_callback(sender, signal_index, argv);

    bool senderDeleted = false;
    {
    Q_ASSERT(sp->connections.loadRelaxed());
    QObjectPrivate::ConnectionDataPointer connections(sp->connections.loadAcquire());
    QObjectPrivate::SignalVector *signalVector = connections->signalVector.loadRelaxed();

    const QObjectPrivate::ConnectionList *list;
    if (signal_index < signalVector->count())
        list = &signalVector->at(signal_index);
    else
        list = &signalVector->at(-1);

    Qt::HANDLE currentThreadId = QThread::currentThreadId();
    bool inSenderThread = currentThreadId == QObjectPrivate::get(sender)->threadData.loadRelaxed()->threadId.loadRelaxed();

    // We need to check against the highest connection id to ensure that signals added
    // during the signal emission are not emitted in this emission.
    uint highestConnectionId = connections->currentConnectionId.loadRelaxed();
    do {
        QObjectPrivate::Connection *c = list->first.loadRelaxed();
        if (!c)
            continue;

        do {
            QObject * const receiver = c->receiver.loadRelaxed();
            if (!receiver)
                continue;

            QThreadData *td = c->receiverThreadData.loadRelaxed();
            if (!td)
                continue;

            bool receiverInSameThread;
            if (inSenderThread) {
                receiverInSameThread = currentThreadId == td->threadId.loadRelaxed();
            } else {
                // need to lock before reading the threadId, because moveToThread() could interfere
                QMutexLocker lock(signalSlotLock(receiver));
                receiverInSameThread = currentThreadId == td->threadId.loadRelaxed();
            }


            // determine if this connection should be sent immediately or
            // put into the event queue
            if ((c->connectionType == Qt::AutoConnection && !receiverInSameThread)
                || (c->connectionType == Qt::QueuedConnection)) {
                queued_activate(sender, signal_index, c, argv);
                continue;
#if QT_CONFIG(thread)
            } else if (c->connectionType == Qt::BlockingQueuedConnection) {
                if (receiverInSameThread) {
                    qWarning("Qt: Dead lock detected while activating a BlockingQueuedConnection: "
                    "Sender is %s(%p), receiver is %s(%p)",
                    sender->metaObject()->className(), sender,
                    receiver->metaObject()->className(), receiver);
                }

                if (c->isSingleShot && !QObjectPrivate::removeConnection(c))
                    continue;

                QSemaphore semaphore;
                {
                    QMutexLocker locker(signalSlotLock(receiver));
                    if (!c->isSingleShot && !c->receiver.loadAcquire())
                        continue;
                    QMetaCallEvent *ev = c->isSlotObject ?
                        new QMetaCallEvent(c->slotObj, sender, signal_index, argv, &semaphore) :
                        new QMetaCallEvent(c->method_offset, c->method_relative, c->callFunction,
                                           sender, signal_index, argv, &semaphore);
                    QCoreApplication::postEvent(receiver, ev);
                }
                semaphore.acquire();
                continue;
#endif
            }

            if (c->isSingleShot && !QObjectPrivate::removeConnection(c))
                continue;

            QObjectPrivate::Sender senderData(
                    receiverInSameThread ? receiver : nullptr, sender, signal_index,
                    receiverInSameThread ? QObjectPrivate::get(receiver)->connections.loadAcquire() : nullptr);

            if (c->isSlotObject) {
                SlotObjectGuard obj{c->slotObj};

                {
                    Q_TRACE_SCOPE(QMetaObject_activate_slot_functor, c->slotObj);
                    obj->call(receiver, argv);
                }
            } else if (c->callFunction && c->method_offset <= receiver->metaObject()->methodOffset()) {
                //we compare the vtable to make sure we are not in the destructor of the object.
                const int method_relative = c->method_relative;
                const auto callFunction = c->callFunction;
                const int methodIndex = (Q_HAS_TRACEPOINTS || callbacks_enabled) ? c->method() : 0;
                if (callbacks_enabled && signal_spy_set->slot_begin_callback != nullptr)
                    signal_spy_set->slot_begin_callback(receiver, methodIndex, argv);

                {
                    Q_TRACE_SCOPE(QMetaObject_activate_slot, receiver, methodIndex);
                    callFunction(receiver, QMetaObject::InvokeMetaMethod, method_relative, argv);
                }

                if (callbacks_enabled && signal_spy_set->slot_end_callback != nullptr)
                    signal_spy_set->slot_end_callback(receiver, methodIndex);
            } else {
                const int method = c->method_relative + c->method_offset;

                if (callbacks_enabled && signal_spy_set->slot_begin_callback != nullptr) {
                    signal_spy_set->slot_begin_callback(receiver, method, argv);
                }

                {
                    Q_TRACE_SCOPE(QMetaObject_activate_slot, receiver, method);
                    QMetaObject::metacall(receiver, QMetaObject::InvokeMetaMethod, method, argv);
                }

                if (callbacks_enabled && signal_spy_set->slot_end_callback != nullptr)
                    signal_spy_set->slot_end_callback(receiver, method);
            }
        } while ((c = c->nextConnectionList.loadRelaxed()) != nullptr && c->id <= highestConnectionId);

    } while (list != &signalVector->at(-1) &&
        //start over for all signals;
        ((list = &signalVector->at(-1)), true));

        if (connections->currentConnectionId.loadRelaxed() == 0)
            senderDeleted = true;
    }
    if (!senderDeleted) {
        sp->connections.loadAcquire()->cleanOrphanedConnections(sender);

        if (callbacks_enabled && signal_spy_set->signal_end_callback != nullptr)
            signal_spy_set->signal_end_callback(sender, signal_index);
    }
}